

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

void AnalyzeFunctionArgumentsFinal
               (ExpressionContext *ctx,SynBase *source,ExprBase *value,
               ArrayView<FunctionValue> functions,SynCallArgument *argumentHead,
               SmallArray<ArgumentData,_16U> *resultArguments)

{
  SynShortFunctionDefinition *syntax;
  FunctionData *pFVar1;
  _func_int **pp_Var2;
  SynIdentifier *pSVar3;
  ExprBase *pEVar4;
  ArgumentData *pAVar5;
  byte bVar6;
  IntrusiveList<MatchData> aliases_00;
  byte bVar7;
  int iVar8;
  undefined4 extraout_var;
  ExprBase *pEVar9;
  SynShortFunctionArgument *pSVar10;
  undefined4 extraout_var_00;
  TypeBase *pTVar11;
  ExprSequence *this;
  undefined4 extraout_var_02;
  ShortFunctionHandle *node_00;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  TypeFunctionSet *pTVar12;
  undefined4 extraout_var_06;
  char *pcVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  Allocator *pAVar17;
  _func_int *p_Var18;
  ulong uVar19;
  bool bVar20;
  ArrayView<ExprBase_*> arr;
  ArrayView<ArgumentData> currArguments;
  ArrayView<ArgumentData> currArguments_00;
  ArrayView<TypeBase_*> setTypes;
  IntrusiveList<ShortFunctionHandle> overloads;
  SmallArray<ExprBase_*,_16U> options;
  IntrusiveList<MatchData> aliases;
  SmallArray<ExprBase_*,_3U> local_1c8;
  ExprBase *local_198;
  ulong local_190;
  IntrusiveList<ShortFunctionHandle> local_188;
  SmallArray<ExprBase_*,_16U> local_170;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [144];
  Allocator *local_38;
  MatchData *node;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  uVar19 = functions._8_8_;
  if (argumentHead != (SynCallArgument *)0x0) {
    local_190 = uVar19 & 0xffffffff;
    uVar15 = 0;
    local_198 = value;
    do {
      if (((int)uVar19 == 0) && (argumentHead->name != (SynIdentifier *)0x0)) {
        anon_unknown.dwarf_1117a3::Stop
                  (ctx,source,"ERROR: function argument names are unknown at this point");
      }
      syntax = (SynShortFunctionDefinition *)argumentHead->value;
      if ((syntax != (SynShortFunctionDefinition *)0x0) && ((syntax->super_SynBase).typeID == 0x39))
      {
        local_170.allocator = ctx->allocator;
        local_170.data = local_170.little;
        local_170.count = 0;
        local_170.max = 0x10;
        if ((int)uVar19 == 0) {
          if (resultArguments->count < uVar15) {
LAB_001f0602:
            __assert_fail("size <= rhs.size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                          ,0x20a,
                          "ArrayView<ArgumentData>::ArrayView(SmallArray<T, N> &, unsigned int) [T = ArgumentData, N = 16U]"
                         );
          }
          local_d8 = 0;
          uStack_d0 = 0;
          currArguments_00.count = uVar15;
          currArguments_00.data = resultArguments->data;
          currArguments_00._12_4_ = 0;
          pEVar9 = AnalyzeShortFunctionDefinition
                             (ctx,syntax,local_198->type,currArguments_00,
                              (IntrusiveList<MatchData>)ZEXT816(0));
          uVar16 = local_170.count;
          if (pEVar9 != (ExprBase *)0x0) {
            if (local_170.count == local_170.max) {
              SmallArray<ExprBase_*,_16U>::grow(&local_170,local_170.count);
            }
            if (local_170.data == (ExprBase **)0x0) {
LAB_001f0657:
              pcVar13 = 
              "void SmallArray<ExprBase *, 16>::push_back(const T &) [T = ExprBase *, N = 16]";
LAB_001f066c:
              __assert_fail("data",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x162,pcVar13);
            }
            uVar19 = local_170._8_8_ & 0xffffffff;
            uVar16 = local_170.count + 1;
            local_170.count = uVar16;
            local_170.data[uVar19] = pEVar9;
          }
        }
        else {
          uVar19 = 0;
          do {
            local_c8._0_8_ = (MatchData *)0x0;
            local_c8._8_4_ = 0;
            local_c8._12_4_ = 0;
            pFVar1 = functions.data[uVar19].function;
            if ((((pFVar1->scope->ownerType != (TypeBase *)0x0) &&
                 (pTVar11 = (functions.data[uVar19].context)->type, pTVar11 != (TypeBase *)0x0)) &&
                (pTVar11->typeID == 0x12)) &&
               ((pp_Var2 = pTVar11[1]._vptr_TypeBase, pp_Var2 != (_func_int **)0x0 &&
                (*(int *)(pp_Var2 + 1) == 0x18)))) {
              for (p_Var18 = pp_Var2[0x1e]; p_Var18 != (_func_int *)0x0;
                  p_Var18 = *(_func_int **)(p_Var18 + 0x10)) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                node = (MatchData *)CONCAT44(extraout_var,iVar8);
                pSVar3 = *(SynIdentifier **)p_Var18;
                pTVar11 = *(TypeBase **)(p_Var18 + 8);
                node->name = pSVar3;
                node->type = pTVar11;
                node->next = (MatchData *)0x0;
                node->listed = false;
                if (pSVar3 == (SynIdentifier *)0x0) {
                  __assert_fail("name",
                                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                                ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
                }
                IntrusiveList<MatchData>::push_back((IntrusiveList<MatchData> *)local_c8,node);
              }
            }
            if (resultArguments->count < uVar15) goto LAB_001f0602;
            aliases_00.tail._4_4_ = local_c8._12_4_;
            aliases_00.tail._0_4_ = local_c8._8_4_;
            aliases_00.head = (MatchData *)local_c8._0_8_;
            currArguments.count = uVar15;
            currArguments.data = resultArguments->data;
            currArguments._12_4_ = 0;
            pEVar9 = AnalyzeShortFunctionDefinition
                               (ctx,syntax,&pFVar1->type->super_TypeBase,currArguments,aliases_00);
            if (pEVar9 != (ExprBase *)0x0) {
              if ((local_170._8_8_ & 0xffffffff) != 0) {
                uVar14 = 0;
                bVar7 = 0;
                do {
                  bVar6 = bVar7;
                  bVar20 = local_170.data[uVar14]->type == pEVar9->type;
                  uVar14 = uVar14 + 1;
                  bVar7 = bVar6 | bVar20;
                } while ((local_170._8_8_ & 0xffffffff) != uVar14);
                if ((bool)(bVar6 | bVar20)) goto LAB_001f00b5;
              }
              if (local_170.count == local_170.max) {
                SmallArray<ExprBase_*,_16U>::grow(&local_170,local_170.count);
              }
              if (local_170.data == (ExprBase **)0x0) goto LAB_001f0657;
              uVar14 = local_170._8_8_ & 0xffffffff;
              local_170.count = local_170.count + 1;
              local_170.data[uVar14] = pEVar9;
            }
LAB_001f00b5:
            uVar19 = uVar19 + 1;
          } while (uVar19 != local_190);
          uVar16 = local_170.count;
        }
        if (uVar16 == 1) {
          pEVar9 = *local_170.data;
        }
        else if (uVar16 == 0) {
          uVar19 = 0;
          for (pSVar10 = (syntax->arguments).head; pSVar10 != (SynShortFunctionArgument *)0x0;
              pSVar10 = (SynShortFunctionArgument *)(pSVar10->super_SynBase).next) {
            uVar19 = (ulong)((int)uVar19 + 1);
          }
          anon_unknown.dwarf_1117a3::Report
                    (ctx,source,
                     "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d"
                     ,uVar19,(ulong)(uVar15 + 1));
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          pEVar9 = (ExprBase *)CONCAT44(extraout_var_00,iVar8);
          pTVar11 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          pEVar9->typeID = 0;
          pEVar9->source = source;
          pEVar9->type = pTVar11;
          pEVar9->next = (ExprBase *)0x0;
          pEVar9->listed = false;
          pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003e6630;
          pEVar9[2]._vptr_ExprBase = (_func_int **)0x0;
          pEVar9[1]._vptr_ExprBase = (_func_int **)&pEVar9[1].source;
          *(undefined8 *)&pEVar9[1].typeID = 0x400000000;
        }
        else {
          local_38 = ctx->allocator;
          local_c8._0_8_ = local_c8 + 0x10;
          local_c8._8_4_ = 0;
          local_c8._12_4_ = 0x10;
          local_188.head = (ShortFunctionHandle *)0x0;
          local_188.tail = (ShortFunctionHandle *)0x0;
          uVar19 = 0;
          do {
            pEVar9 = local_170.data[uVar19];
            if ((pEVar9 == (ExprBase *)0x0) || ((pEVar9->typeID & 0xfffffffe) != 0x24)) {
              __assert_fail("isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option)"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                            ,0x1cbb,
                            "void AnalyzeFunctionArgumentsFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, SynCallArgument *, SmallArray<ArgumentData, 16> &)"
                           );
            }
            if (local_c8._8_4_ == local_c8._12_4_) {
              SmallArray<TypeBase_*,_16U>::grow
                        ((SmallArray<TypeBase_*,_16U> *)local_c8,local_c8._8_4_);
            }
            if ((MatchData *)local_c8._0_8_ == (MatchData *)0x0) {
              pcVar13 = 
              "void SmallArray<TypeBase *, 16>::push_back(const T &) [T = TypeBase *, N = 16]";
              goto LAB_001f066c;
            }
            uVar14 = (ulong)(uint)local_c8._8_4_;
            local_c8._8_4_ = local_c8._8_4_ + 1;
            ((SynIdentifier **)local_c8._0_8_)[uVar14] = (SynIdentifier *)pEVar9->type;
            if ((local_170._8_8_ & 0xffffffff) <= uVar19) {
              pcVar13 = 
              "T &SmallArray<ExprBase *, 16>::operator[](unsigned int) [T = ExprBase *, N = 16]";
              goto LAB_001f0636;
            }
            pEVar4 = local_170.data[uVar19];
            if ((pEVar4 == (ExprBase *)0x0) || (pEVar4->typeID != 0x24)) {
              if (pEVar9->typeID == 0x25) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                this = (ExprSequence *)CONCAT44(extraout_var_02,iVar8);
                pTVar11 = (TypeBase *)pEVar9[1]._vptr_ExprBase[6];
                (this->super_ExprBase).typeID = 9;
                (this->super_ExprBase).source = source;
                (this->super_ExprBase).type = pTVar11;
                (this->super_ExprBase).next = (ExprBase *)0x0;
                (this->super_ExprBase).listed = false;
                (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
                node_00 = (ShortFunctionHandle *)CONCAT44(extraout_var_03,iVar8);
                goto LAB_001f0495;
              }
            }
            else {
              pEVar9 = *(ExprBase **)&pEVar4[2].typeID;
              if (pEVar9 == (ExprBase *)0x0) {
                iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x30);
                this = (ExprSequence *)CONCAT44(extraout_var_04,iVar8);
                pTVar11 = (TypeBase *)pEVar4[1]._vptr_ExprBase[6];
                (this->super_ExprBase).typeID = 9;
                (this->super_ExprBase).source = source;
                (this->super_ExprBase).type = pTVar11;
                (this->super_ExprBase).next = (ExprBase *)0x0;
                (this->super_ExprBase).listed = false;
                (this->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e65c0;
              }
              else {
                pAVar17 = ctx->allocator;
                local_1c8.data = local_1c8.little;
                local_1c8.count = 2;
                local_1c8.max = 3;
                local_1c8.little[0] = pEVar4;
                local_1c8.little[1] = pEVar9;
                local_1c8.allocator = pAVar17;
                if ((VariableData *)pEVar4[2].source != (VariableData *)0x0) {
                  pEVar9 = CreateVariableAccess(ctx,source,(VariableData *)pEVar4[2].source,true);
                  if (local_1c8.count == local_1c8.max) {
                    SmallArray<ExprBase_*,_3U>::grow(&local_1c8,local_1c8.count);
                  }
                  if (local_1c8.data == (ExprBase **)0x0) {
                    pcVar13 = 
                    "void SmallArray<ExprBase *, 3>::push_back(const T &) [T = ExprBase *, N = 3]";
                    goto LAB_001f066c;
                  }
                  uVar14 = (ulong)local_1c8.count;
                  local_1c8.count = local_1c8.count + 1;
                  local_1c8.data[uVar14] = pEVar9;
                  pAVar17 = ctx->allocator;
                }
                iVar8 = (*pAVar17->_vptr_Allocator[2])(pAVar17,0x68);
                this = (ExprSequence *)CONCAT44(extraout_var_01,iVar8);
                arr.count = local_1c8.count;
                arr.data = local_1c8.data;
                arr._12_4_ = 0;
                ExprSequence::ExprSequence
                          (this,ctx->allocator,source,(TypeBase *)pEVar4[1]._vptr_ExprBase[6],arr);
                SmallArray<ExprBase_*,_3U>::~SmallArray(&local_1c8);
              }
              iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
              node_00 = (ShortFunctionHandle *)CONCAT44(extraout_var_05,iVar8);
              pEVar9 = pEVar4;
LAB_001f0495:
              node_00->function = (FunctionData *)pEVar9[1]._vptr_ExprBase;
              node_00->context = &this->super_ExprBase;
              node_00->next = (ShortFunctionHandle *)0x0;
              node_00->listed = false;
              IntrusiveList<ShortFunctionHandle>::push_back(&local_188,node_00);
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 < (local_170._8_8_ & 0xffffffff));
          setTypes.count = local_c8._8_4_;
          setTypes.data = (TypeBase **)local_c8._0_8_;
          setTypes._12_4_ = 0;
          pTVar12 = ExpressionContext::GetFunctionSetType(ctx,setTypes);
          iVar8 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
          pEVar9 = (ExprBase *)CONCAT44(extraout_var_06,iVar8);
          pEVar9->typeID = 0x28;
          pEVar9->source = source;
          pEVar9->type = &pTVar12->super_TypeBase;
          pEVar9->next = (ExprBase *)0x0;
          pEVar9->listed = false;
          pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003e6ac8;
          pEVar9[1]._vptr_ExprBase = (_func_int **)local_188.head;
          *(ShortFunctionHandle **)&pEVar9[1].typeID = local_188.tail;
          SmallArray<TypeBase_*,_16U>::~SmallArray((SmallArray<TypeBase_*,_16U> *)local_c8);
        }
        if (resultArguments->count <= uVar15) {
          pcVar13 = 
          "T &SmallArray<ArgumentData, 16>::operator[](unsigned int) [T = ArgumentData, N = 16]";
LAB_001f0636:
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,pcVar13);
        }
        pTVar11 = pEVar9->type;
        pSVar3 = argumentHead->name;
        pAVar5 = resultArguments->data;
        pAVar5[uVar15].source = &argumentHead->super_SynBase;
        pAVar5[uVar15].isExplicit = false;
        pAVar5[uVar15].name = pSVar3;
        pAVar5[uVar15].type = pTVar11;
        pAVar5[uVar15].value = pEVar9;
        pAVar5[uVar15].valueFunction = (FunctionData *)0x0;
        SmallArray<ExprBase_*,_16U>::~SmallArray(&local_170);
        uVar19 = (ulong)functions.count;
      }
      argumentHead = (SynCallArgument *)(argumentHead->super_SynBase).next;
    } while ((argumentHead != (SynCallArgument *)0x0) &&
            (uVar15 = uVar15 + 1, (argumentHead->super_SynBase).typeID == 0x18));
  }
  return;
}

Assistant:

void AnalyzeFunctionArgumentsFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, SynCallArgument *argumentHead, SmallArray<ArgumentData, 16> &resultArguments)
{
	unsigned pos = 0;

	for(SynCallArgument *el = argumentHead; el; el = getType<SynCallArgument>(el->next))
	{
		if(functions.empty() && el->name)
			Stop(ctx, source, "ERROR: function argument names are unknown at this point");

		if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(el->value))
		{
			SmallArray<ExprBase*, 16> options(ctx.allocator);

			if(functions.empty())
			{
				if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, value->type, ArrayView<ArgumentData>(resultArguments, pos), IntrusiveList<MatchData>()))
					options.push_back(option);
			}
			else
			{
				for(unsigned i = 0; i < functions.size(); i++)
				{
					IntrusiveList<MatchData> aliases;

					FunctionData *function = functions[i].function;

					if(function->scope->ownerType)
					{
						if(TypeRef *contextType = getType<TypeRef>(functions[i].context->type))
						{
							if(TypeClass *classType = getType<TypeClass>(contextType->subType))
							{
								for(MatchData *el = classType->generics.head; el; el = el->next)
									aliases.push_back(new (ctx.get<MatchData>()) MatchData(el->name, el->type));
							}
						}
					}

					if(ExprBase *option = AnalyzeShortFunctionDefinition(ctx, node, function->type, ArrayView<ArgumentData>(resultArguments, pos), aliases))
					{
						bool found = false;

						for(unsigned k = 0; k < options.size(); k++)
						{
							if(options[k]->type == option->type)
								found = true;
						}

						if(!found)
							options.push_back(option);
					}
				}
			}

			ExprBase *argument = NULL;

			if(options.empty())
			{
				Report(ctx, source, "ERROR: cannot find function which accepts a function with %d argument(s) as an argument #%d", node->arguments.size(), pos + 1);

				argument = new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}
			else if(options.size() == 1)
			{
				argument = options[0];
			}
			else
			{
				SmallArray<TypeBase*, 16> types(ctx.allocator);

				IntrusiveList<ShortFunctionHandle> overloads;

				for(unsigned i = 0; i < options.size(); i++)
				{
					ExprBase *option = options[i];

					assert(isType<ExprFunctionDefinition>(option) || isType<ExprGenericFunctionPrototype>(option));

					types.push_back(option->type);

					if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(options[i]))
					{
						ExprBase *context = NULL;

						if(node->contextVariableDefinition)
						{
							SmallArray<ExprBase*, 3> expressions(ctx.allocator);

							expressions.push_back(node);

							if(node->contextVariableDefinition)
								expressions.push_back(node->contextVariableDefinition);

							if(node->contextVariable)
								expressions.push_back(CreateVariableAccess(ctx, source, node->contextVariable, true));

							context = new (ctx.get<ExprSequence>()) ExprSequence(ctx.allocator, source, node->function->contextType, expressions);
						}
						else
						{
							context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);
						}

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
					else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(option))
					{
						ExprBase *context = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, node->function->contextType);

						overloads.push_back(new (ctx.get<ShortFunctionHandle>()) ShortFunctionHandle(node->function, context));
					}
				}

				TypeFunctionSet *type = ctx.GetFunctionSetType(types);

				argument = new (ctx.get<ExprShortFunctionOverloadSet>()) ExprShortFunctionOverloadSet(source, type, overloads);
			}

			resultArguments[pos++] = ArgumentData(el, false, el->name, argument->type, argument);
		}
		else
		{
			pos++;
		}
	}
}